

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O2

void gl4cts::CopyImage::Utils::maskPixelForFormat(GLenum internal_format,GLubyte *pixel)

{
  if (internal_format == 0x8052) {
    *pixel = *pixel | 3;
  }
  return;
}

Assistant:

void Utils::maskPixelForFormat(GLenum internal_format, GLubyte* pixel)
{
	switch (internal_format)
	{
	case GL_RGB10:
		/* UINT_10_10_10_2 - ALPHA will be set to 3*/
		pixel[0] |= 0x03;
		break;

	default:
		break;
	}
}